

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isEquivalent(Type *this,Type *rhs)

{
  int iVar1;
  int iVar2;
  SymbolKind SVar3;
  int iVar4;
  bool bVar5;
  Type *this_00;
  Type *pTVar6;
  Type *this_01;
  int iVar7;
  IntegralType *li;
  Type *pTVar8;
  IntegralType *ri;
  
  do {
    while( true ) {
      this_00 = getCanonicalType(this);
      pTVar6 = getCanonicalType(rhs);
      bVar5 = isMatching(this_00,pTVar6);
      if (bVar5) {
        return true;
      }
      bVar5 = isIntegral(this_00);
      if ((((bVar5) && (bVar5 = isIntegral(pTVar6), bVar5)) && (bVar5 = isEnum(this_00), !bVar5)) &&
         (bVar5 = isEnum(pTVar6), !bVar5)) {
        if ((this_00[1].super_Symbol.field_0x4 == pTVar6[1].super_Symbol.field_0x4) &&
           (this_00[1].super_Symbol.field_0x5 == pTVar6[1].super_Symbol.field_0x5)) {
          return this_00[1].super_Symbol.kind == pTVar6[1].super_Symbol.kind;
        }
        return false;
      }
      if (((this_00->super_Symbol).kind != FixedSizeUnpackedArrayType) ||
         ((pTVar6->super_Symbol).kind != FixedSizeUnpackedArrayType)) break;
      iVar2 = (int)pTVar6[1].super_Symbol.name._M_len;
      iVar7 = *(int *)((long)&pTVar6[1].super_Symbol.name._M_len + 4);
      iVar1 = (int)this_00[1].super_Symbol.name._M_len;
      iVar4 = iVar2 - iVar7;
      if (iVar2 - iVar7 == 0 || iVar2 < iVar7) {
        iVar4 = -(iVar2 - iVar7);
      }
      iVar2 = *(int *)((long)&this_00[1].super_Symbol.name._M_len + 4);
      iVar7 = iVar1 - iVar2;
      if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
        iVar7 = -(iVar1 - iVar2);
      }
      if (iVar7 != iVar4) {
        return false;
      }
      this = *(Type **)&this_00[1].super_Symbol;
      rhs = *(Type **)&pTVar6[1].super_Symbol;
    }
    bVar5 = isUnpackedArray(this_00);
    pTVar8 = pTVar6;
    if ((bVar5) && (SVar3 = (this_00->super_Symbol).kind, SVar3 == (pTVar6->super_Symbol).kind)) {
      if (SVar3 == AssociativeArrayType) {
        this_01 = getAssociativeIndexType(this_00);
        pTVar6 = getAssociativeIndexType(pTVar6);
        if (this_01 == (Type *)0x0) {
          if (pTVar6 != (Type *)0x0) {
            return false;
          }
        }
        else {
          if (pTVar6 == (Type *)0x0) {
            return false;
          }
          bVar5 = isEquivalent(this_01,pTVar6);
          if (!bVar5) {
            return false;
          }
        }
      }
      this = getArrayElementType(this_00);
    }
    else {
      bVar5 = isUntypedType(this_00);
      if (bVar5) {
        return true;
      }
      bVar5 = isUntypedType(pTVar6);
      if (bVar5) {
        return true;
      }
      if (((this_00->super_Symbol).kind != DPIOpenArrayType) &&
         (pTVar8 = this_00, this_00 = pTVar6, (pTVar6->super_Symbol).kind != DPIOpenArrayType)) {
        return false;
      }
      if ((char)this_00[1].super_Symbol.name._M_len == '\x01') {
        bVar5 = isIntegral(pTVar8);
        return bVar5;
      }
      if (1 < (pTVar8->super_Symbol).kind - FixedSizeUnpackedArrayType) {
        return false;
      }
      this = getArrayElementType(this_00);
    }
    rhs = getArrayElementType(pTVar8);
  } while( true );
}

Assistant:

bool Type::isEquivalent(const Type& rhs) const {
    // See [6.22.2] for Equivalent Types
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isMatching(*r))
        return true;

    // (c) packed integral types are equivalent if signedness, four-statedness,
    // and bitwidth are the same.
    if (l->isIntegral() && r->isIntegral() && !l->isEnum() && !r->isEnum()) {
        const auto& li = l->as<IntegralType>();
        const auto& ri = r->as<IntegralType>();
        return li.isSigned == ri.isSigned && li.isFourState == ri.isFourState &&
               li.bitWidth == ri.bitWidth;
    }

    // (d) fixed size unpacked arrays are equivalent if element types are equivalent
    // and ranges are the same width; actual bounds may differ.
    if (l->kind == SymbolKind::FixedSizeUnpackedArrayType &&
        r->kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& la = l->as<FixedSizeUnpackedArrayType>();
        auto& ra = r->as<FixedSizeUnpackedArrayType>();
        return la.range.width() == ra.range.width() && la.elementType.isEquivalent(ra.elementType);
    }

    // (e) dynamic arrays, associative arrays, and queues are equivalent if they
    // are the same kind and have equivalent element types.
    if (l->isUnpackedArray() && l->kind == r->kind) {
        // Associative arrays additionally must have the same index type.
        if (l->kind == SymbolKind::AssociativeArrayType) {
            auto li = l->getAssociativeIndexType();
            auto ri = r->getAssociativeIndexType();
            if (li) {
                if (!ri || !li->isEquivalent(*ri))
                    return false;
            }
            else if (ri) {
                return false;
            }
        }

        return l->getArrayElementType()->isEquivalent(*r->getArrayElementType());
    }

    // The 'untyped' type is equivalent with everything.
    if (l->isUntypedType() || r->isUntypedType())
        return true;

    // Special case for DPI open arrays, which can only be declared for arguments
    // of DPI import functions. Arrays of any width can be converted to them,
    // which we will implement here even though it's not strictly "equivalent".
    if (l->kind == SymbolKind::DPIOpenArrayType || r->kind == SymbolKind::DPIOpenArrayType) {
        if (l->kind != SymbolKind::DPIOpenArrayType)
            std::swap(l, r);

        // Any integral type converts to a packed DPI open array.
        if (l->as<DPIOpenArrayType>().isPacked)
            return r->isIntegral();

        // Unpacked open arrays match fixed size unpacked arrays of any width.
        if (r->kind == SymbolKind::FixedSizeUnpackedArrayType ||
            r->kind == SymbolKind::DynamicArrayType) {
            return l->getArrayElementType()->isEquivalent(*r->getArrayElementType());
        }
    }

    return false;
}